

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NeuralNetworkLayer::NeuralNetworkLayer(NeuralNetworkLayer *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NeuralNetworkLayer_003d2780;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->input_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->input_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->input_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->input_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->output_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->output_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->output_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->output_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->inputtensor_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->inputtensor_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->inputtensor_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->inputtensor_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->outputtensor_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->outputtensor_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->outputtensor_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->outputtensor_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (this != (NeuralNetworkLayer *)&_NeuralNetworkLayer_default_instance_) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  (this->name_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->isupdatable_ = false;
  this->_cached_size_ = 0;
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

NeuralNetworkLayer::NeuralNetworkLayer()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.NeuralNetworkLayer)
}